

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O0

void ApplyClampedForce(Node *n,btVector3 *f,btScalar dt)

{
  btScalar *s;
  btVector3 *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  btScalar bVar1;
  btScalar bVar2;
  btVector3 bVar3;
  btScalar dtim;
  undefined4 in_stack_ffffffffffffffa0;
  btVector3 *this;
  undefined1 in_stack_ffffffffffffffa8 [16];
  btVector3 local_38;
  btScalar local_28 [4];
  float local_18;
  btVector3 *local_10;
  long local_8;
  
  this = in_stack_ffffffffffffffa8._0_8_;
  local_18 = in_XMM0_Da * *(float *)(in_RDI + 0x60);
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_28 = (btScalar  [4])operator*(in_stack_ffffffffffffffa8._8_8_,this->m_floats);
  bVar1 = btVector3::length2((btVector3 *)0x26bd03);
  bVar2 = btVector3::length2((btVector3 *)0x26bd17);
  if (bVar1 <= bVar2) {
    btVector3::operator+=((btVector3 *)(local_8 + 0x40),local_10);
  }
  else {
    s = (btScalar *)(local_8 + 0x30);
    bVar3 = btVector3::normalized(this);
    ProjectOnAxis(bVar3.m_floats._8_8_,bVar3.m_floats._0_8_);
    local_38 = operator/((btVector3 *)CONCAT44(bVar1,in_stack_ffffffffffffffa0),s);
    btVector3::operator-=((btVector3 *)(local_8 + 0x40),&local_38);
  }
  return;
}

Assistant:

static inline void			ApplyClampedForce(	btSoftBody::Node& n,
											  const btVector3& f,
											  btScalar dt)
{
	const btScalar	dtim=dt*n.m_im;
	if((f*dtim).length2()>n.m_v.length2())
	{/* Clamp	*/ 
		n.m_f-=ProjectOnAxis(n.m_v,f.normalized())/dtim;						
	}
	else
	{/* Apply	*/ 
		n.m_f+=f;
	}
}